

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::
     SPxShellsort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
               (int *keys,int end,
               Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *compare,int start)

{
  int iVar1;
  undefined4 uVar2;
  int in_ECX;
  int in_ESI;
  long in_RDI;
  int tempkey;
  int j;
  int i;
  int first;
  int h;
  int k;
  type_conflict5 local_71;
  uint in_stack_ffffffffffffff94;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffa8;
  int local_30;
  int local_2c;
  int local_20;
  
  for (local_20 = 2; -1 < local_20; local_20 = local_20 + -1) {
    iVar1 = SPxShellsort<int,_soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ::incs[local_20];
    for (local_2c = iVar1 + in_ECX; local_2c <= in_ESI; local_2c = local_2c + 1) {
      uVar2 = *(undefined4 *)(in_RDI + (long)local_2c * 4);
      local_30 = local_2c;
      while( true ) {
        local_71 = false;
        if (iVar1 + in_ECX <= local_30) {
          Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator()(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                      );
          local_71 = boost::multiprecision::operator<
                               (in_stack_ffffffffffffff98,
                                (int *)((ulong)in_stack_ffffffffffffff94 << 0x20));
        }
        if (local_71 == false) break;
        *(undefined4 *)(in_RDI + (long)local_30 * 4) =
             *(undefined4 *)(in_RDI + (long)(local_30 - iVar1) * 4);
        local_30 = local_30 - iVar1;
      }
      *(undefined4 *)(in_RDI + (long)local_30 * 4) = uVar2;
    }
  }
  return;
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}